

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::extractIis(Highs *this,HighsInt *num_iis_col,HighsInt *num_iis_row,HighsInt *iis_col_index,
                 HighsInt *iis_row_index,HighsInt *iis_col_bound,HighsInt *iis_row_bound)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  HighsInt iCol;
  long lVar4;
  
  piVar1 = (this->iis_).col_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *num_iis_col = (HighsInt)
                 ((ulong)((long)(this->iis_).col_index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  piVar2 = (this->iis_).row_index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *num_iis_row = (HighsInt)
                 ((ulong)((long)(this->iis_).row_index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  if ((iis_col_index != (HighsInt *)0x0 || iis_col_bound != (HighsInt *)0x0) && (0 < *num_iis_col))
  {
    piVar3 = (this->iis_).col_bound_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      if (iis_col_index != (HighsInt *)0x0) {
        iis_col_index[lVar4] = piVar1[lVar4];
      }
      if (iis_col_bound != (HighsInt *)0x0) {
        iis_col_bound[lVar4] = piVar3[lVar4];
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *num_iis_col);
  }
  if ((iis_row_index != (HighsInt *)0x0 || iis_row_bound != (HighsInt *)0x0) && (0 < *num_iis_row))
  {
    piVar1 = (this->iis_).row_bound_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      if (iis_row_index != (HighsInt *)0x0) {
        iis_row_index[lVar4] = piVar2[lVar4];
      }
      if (iis_row_bound != (HighsInt *)0x0) {
        iis_row_bound[lVar4] = piVar1[lVar4];
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *num_iis_row);
  }
  return kOk;
}

Assistant:

HighsStatus Highs::extractIis(HighsInt& num_iis_col, HighsInt& num_iis_row,
                              HighsInt* iis_col_index, HighsInt* iis_row_index,
                              HighsInt* iis_col_bound,
                              HighsInt* iis_row_bound) {
  assert(this->iis_.valid_);
  num_iis_col = this->iis_.col_index_.size();
  num_iis_row = this->iis_.row_index_.size();
  if (iis_col_index || iis_col_bound) {
    for (HighsInt iCol = 0; iCol < num_iis_col; iCol++) {
      if (iis_col_index) iis_col_index[iCol] = this->iis_.col_index_[iCol];
      if (iis_col_bound) iis_col_bound[iCol] = this->iis_.col_bound_[iCol];
    }
  }
  if (iis_row_index || iis_row_bound) {
    for (HighsInt iRow = 0; iRow < num_iis_row; iRow++) {
      if (iis_row_index) iis_row_index[iRow] = this->iis_.row_index_[iRow];
      if (iis_row_bound) iis_row_bound[iRow] = this->iis_.row_bound_[iRow];
    }
  }
  return HighsStatus::kOk;
}